

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPCompoundPacket::ParseData(RTCPCompoundPacket *this,uint8_t *data,size_t datalen)

{
  uint16_t uVar1;
  RTPMemoryManager *pRVar2;
  RTCPSDESPacket *pRVar3;
  RTCPSDESPacket *local_48;
  RTCPPacket *p;
  size_t length;
  RTCPCommonHeader *rtcphdr;
  RTCPPacket *pRStack_28;
  bool first;
  size_t datalen_local;
  uint8_t *data_local;
  RTCPCompoundPacket *this_local;
  
  if (datalen < 4) {
    this_local._4_4_ = -0x1e;
  }
  else {
    rtcphdr._7_1_ = 1;
    pRStack_28 = (RTCPPacket *)datalen;
    datalen_local = (size_t)data;
    data_local = (uint8_t *)this;
    do {
      length = datalen_local;
      if (*(byte *)datalen_local >> 6 != 2) {
        ClearPacketList(this);
        return -0x1e;
      }
      if ((((rtcphdr._7_1_ & 1) != 0) && (rtcphdr._7_1_ = 0, *(char *)(datalen_local + 1) != -0x38))
         && (*(char *)(datalen_local + 1) != -0x37)) {
        ClearPacketList(this);
        return -0x1e;
      }
      uVar1 = ntohs(*(uint16_t *)(datalen_local + 2));
      p = (RTCPPacket *)(((ulong)uVar1 + 1) * 4);
      if (pRStack_28 < p) {
        ClearPacketList(this);
        return -0x1e;
      }
      if (((*(byte *)length >> 5 & 1) != 0) && (p != pRStack_28)) {
        ClearPacketList(this);
        return -0x1e;
      }
      switch(*(undefined1 *)(length + 1)) {
      case 200:
        pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        pRVar3 = (RTCPSDESPacket *)operator_new(0x20,pRVar2,0x15);
        RTCPSRPacket::RTCPSRPacket((RTCPSRPacket *)pRVar3,(uint8_t *)datalen_local,(size_t)p);
        local_48 = pRVar3;
        break;
      case 0xc9:
        pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        pRVar3 = (RTCPSDESPacket *)operator_new(0x20,pRVar2,0x13);
        RTCPRRPacket::RTCPRRPacket((RTCPRRPacket *)pRVar3,(uint8_t *)datalen_local,(size_t)p);
        local_48 = pRVar3;
        break;
      case 0xca:
        pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        pRVar3 = (RTCPSDESPacket *)operator_new(0x38,pRVar2,0x14);
        RTCPSDESPacket::RTCPSDESPacket(pRVar3,(uint8_t *)datalen_local,(size_t)p);
        local_48 = pRVar3;
        break;
      case 0xcb:
        pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        pRVar3 = (RTCPSDESPacket *)operator_new(0x28,pRVar2,0x10);
        RTCPBYEPacket::RTCPBYEPacket((RTCPBYEPacket *)pRVar3,(uint8_t *)datalen_local,(size_t)p);
        local_48 = pRVar3;
        break;
      case 0xcc:
        pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        pRVar3 = (RTCPSDESPacket *)operator_new(0x28,pRVar2,0xf);
        RTCPAPPPacket::RTCPAPPPacket((RTCPAPPPacket *)pRVar3,(uint8_t *)datalen_local,(size_t)p);
        local_48 = pRVar3;
        break;
      default:
        pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        pRVar3 = (RTCPSDESPacket *)operator_new(0x20,pRVar2,0x16);
        RTCPUnknownPacket::RTCPUnknownPacket
                  ((RTCPUnknownPacket *)pRVar3,(uint8_t *)datalen_local,(size_t)p);
        local_48 = pRVar3;
      }
      if (local_48 == (RTCPSDESPacket *)0x0) {
        ClearPacketList(this);
        return -1;
      }
      std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::push_back
                (&this->rtcppacklist,(value_type *)&local_48);
      pRStack_28 = (RTCPPacket *)((long)pRStack_28 - (long)p);
      datalen_local = (long)&p->_vptr_RTCPPacket + datalen_local;
    } while ((RTCPPacket *)0x3 < pRStack_28);
    if (pRStack_28 == (RTCPPacket *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      ClearPacketList(this);
      this_local._4_4_ = -0x1e;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTCPCompoundPacket::ParseData(uint8_t *data, size_t datalen)
{
	bool first;
	
	if (datalen < sizeof(RTCPCommonHeader))
		return ERR_RTP_RTCPCOMPOUND_INVALIDPACKET;

	first = true;
	
	do
	{
		RTCPCommonHeader *rtcphdr;
		size_t length;
		
		rtcphdr = (RTCPCommonHeader *)data;
		if (rtcphdr->version != RTP_VERSION) // check version
		{
			ClearPacketList();
			return ERR_RTP_RTCPCOMPOUND_INVALIDPACKET;
		}
		if (first)
		{
			// Check if first packet is SR or RR
			
			first = false;
			if ( ! (rtcphdr->packettype == RTP_RTCPTYPE_SR || rtcphdr->packettype == RTP_RTCPTYPE_RR))
			{
				ClearPacketList();
				return ERR_RTP_RTCPCOMPOUND_INVALIDPACKET;
			}
		}
		
		length = (size_t)ntohs(rtcphdr->length);
		length++;
		length *= sizeof(uint32_t);

		if (length > datalen) // invalid length field
		{
			ClearPacketList();
			return ERR_RTP_RTCPCOMPOUND_INVALIDPACKET;
		}
		
		if (rtcphdr->padding)
		{
			// check if it's the last packet
			if (length != datalen)
			{
				ClearPacketList();
				return ERR_RTP_RTCPCOMPOUND_INVALIDPACKET;
			}
		}

		RTCPPacket *p;
		
		switch (rtcphdr->packettype)
		{
		case RTP_RTCPTYPE_SR:
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPSRPACKET) RTCPSRPacket(data,length);
			break;
		case RTP_RTCPTYPE_RR:
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPRRPACKET) RTCPRRPacket(data,length);
			break;
		case RTP_RTCPTYPE_SDES:
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPSDESPACKET) RTCPSDESPacket(data,length);
			break;
		case RTP_RTCPTYPE_BYE:
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPBYEPACKET) RTCPBYEPacket(data,length);
			break;
		case RTP_RTCPTYPE_APP:
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPAPPPACKET) RTCPAPPPacket(data,length);
			break;
		default:
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPUNKNOWNPACKET) RTCPUnknownPacket(data,length);
		}

		if (p == 0)
		{
			ClearPacketList();
			return ERR_RTP_OUTOFMEM;
		}

		rtcppacklist.push_back(p);
		
		datalen -= length;
		data += length;
	} while (datalen >= (size_t)sizeof(RTCPCommonHeader));

	if (datalen != 0) // some remaining bytes
	{
		ClearPacketList();
		return ERR_RTP_RTCPCOMPOUND_INVALIDPACKET;
	}
	return 0;
}